

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_uefitool.cpp
# Opt level: O2

void UEFITool::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  undefined8 *puVar1;
  undefined4 in_register_00000034;
  
  if (_c != RegisterMethodArgumentMetaType) {
    if (_c == InvokeMetaMethod) {
      switch(_id) {
      case 0:
        init((UEFITool *)_o,(EVP_PKEY_CTX *)CONCAT44(in_register_00000034,_c));
        return;
      case 1:
        populateUi((UEFITool *)_o,(QItemSelection *)_a[1]);
        return;
      case 2:
        populateUi((UEFITool *)_o,(QModelIndex *)_a[1]);
        return;
      case 3:
        scrollTreeView((UEFITool *)_o,*_a[1]);
        return;
      case 4:
        scrollTreeView((UEFITool *)_o,*_a[1]);
        return;
      case 5:
        openImageFile((UEFITool *)_o);
        return;
      case 6:
        openImageFileInNewWindow((UEFITool *)_o);
        return;
      case 7:
        saveImageFile((UEFITool *)_o);
        return;
      case 8:
        search((UEFITool *)_o);
        return;
      case 9:
        goToBase((UEFITool *)_o);
        return;
      case 10:
        goToAddress((UEFITool *)_o);
        return;
      case 0xb:
        hexView((UEFITool *)_o);
        return;
      case 0xc:
        bodyHexView((UEFITool *)_o);
        return;
      case 0xd:
        uncompressedHexView((UEFITool *)_o);
        return;
      case 0xe:
        goToData((UEFITool *)_o);
        return;
      case 0xf:
        extract((UEFITool *)_o,*_a[1]);
        return;
      case 0x10:
        extractAsIs((UEFITool *)_o);
        return;
      case 0x11:
        extractBody((UEFITool *)_o);
        return;
      case 0x12:
        extractBodyUncompressed((UEFITool *)_o);
        return;
      case 0x13:
        insert((UEFITool *)_o,*_a[1]);
        return;
      case 0x14:
        insertInto((UEFITool *)_o);
        return;
      case 0x15:
        insertBefore((UEFITool *)_o);
        return;
      case 0x16:
        insertAfter((UEFITool *)_o);
        return;
      case 0x17:
        replace((UEFITool *)_o,*_a[1]);
        return;
      case 0x18:
        replaceAsIs((UEFITool *)_o);
        return;
      case 0x19:
        replaceBody((UEFITool *)_o);
        return;
      case 0x1a:
        rebuild((UEFITool *)_o);
        return;
      case 0x1b:
        remove((UEFITool *)_o,(char *)CONCAT44(in_register_00000034,_c));
        return;
      case 0x1c:
        copyMessage((UEFITool *)_o);
        return;
      case 0x1d:
        copyAllMessages((UEFITool *)_o);
        return;
      case 0x1e:
        enableMessagesCopyActions((UEFITool *)_o,*_a[1]);
        return;
      case 0x1f:
        clearMessages((UEFITool *)_o);
        return;
      case 0x20:
        toggleBootGuardMarking((UEFITool *)_o,*_a[1]);
        return;
      case 0x21:
        about((UEFITool *)_o);
        return;
      case 0x22:
        aboutQt((UEFITool *)_o);
        return;
      case 0x23:
        exit((UEFITool *)_o,0);
        return;
      case 0x24:
        writeSettings((UEFITool *)_o);
        return;
      case 0x25:
        loadGuidDatabase((UEFITool *)_o);
        return;
      case 0x26:
        unloadGuidDatabase((UEFITool *)_o);
        return;
      case 0x27:
        loadDefaultGuidDatabase((UEFITool *)_o);
        return;
      case 0x28:
        exportDiscoveredGuids((UEFITool *)_o);
        return;
      case 0x29:
        generateReport((UEFITool *)_o);
        return;
      case 0x2a:
        currentTabChanged((UEFITool *)_o,*_a[1]);
        return;
      }
    }
    return;
  }
  if (_id == 1) {
    puVar1 = (undefined8 *)*_a;
    if (*_a[1] == 0) {
      *puVar1 = &QtPrivate::QMetaTypeInterfaceWrapper<QItemSelection>::metaType;
      return;
    }
  }
  else {
    puVar1 = (undefined8 *)*_a;
  }
  *puVar1 = 0;
  return;
}

Assistant:

void UEFITool::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    if (_c == QMetaObject::InvokeMetaMethod) {
        auto *_t = static_cast<UEFITool *>(_o);
        (void)_t;
        switch (_id) {
        case 0: _t->init(); break;
        case 1: _t->populateUi((*reinterpret_cast< std::add_pointer_t<QItemSelection>>(_a[1]))); break;
        case 2: _t->populateUi((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1]))); break;
        case 3: _t->scrollTreeView((*reinterpret_cast< std::add_pointer_t<QListWidgetItem*>>(_a[1]))); break;
        case 4: _t->scrollTreeView((*reinterpret_cast< std::add_pointer_t<QTableWidgetItem*>>(_a[1]))); break;
        case 5: _t->openImageFile(); break;
        case 6: _t->openImageFileInNewWindow(); break;
        case 7: _t->saveImageFile(); break;
        case 8: _t->search(); break;
        case 9: _t->goToBase(); break;
        case 10: _t->goToAddress(); break;
        case 11: _t->hexView(); break;
        case 12: _t->bodyHexView(); break;
        case 13: _t->uncompressedHexView(); break;
        case 14: _t->goToData(); break;
        case 15: _t->extract((*reinterpret_cast< std::add_pointer_t<UINT8>>(_a[1]))); break;
        case 16: _t->extractAsIs(); break;
        case 17: _t->extractBody(); break;
        case 18: _t->extractBodyUncompressed(); break;
        case 19: _t->insert((*reinterpret_cast< std::add_pointer_t<UINT8>>(_a[1]))); break;
        case 20: _t->insertInto(); break;
        case 21: _t->insertBefore(); break;
        case 22: _t->insertAfter(); break;
        case 23: _t->replace((*reinterpret_cast< std::add_pointer_t<UINT8>>(_a[1]))); break;
        case 24: _t->replaceAsIs(); break;
        case 25: _t->replaceBody(); break;
        case 26: _t->rebuild(); break;
        case 27: _t->remove(); break;
        case 28: _t->copyMessage(); break;
        case 29: _t->copyAllMessages(); break;
        case 30: _t->enableMessagesCopyActions((*reinterpret_cast< std::add_pointer_t<QListWidgetItem*>>(_a[1]))); break;
        case 31: _t->clearMessages(); break;
        case 32: _t->toggleBootGuardMarking((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 33: _t->about(); break;
        case 34: _t->aboutQt(); break;
        case 35: _t->exit(); break;
        case 36: _t->writeSettings(); break;
        case 37: _t->loadGuidDatabase(); break;
        case 38: _t->unloadGuidDatabase(); break;
        case 39: _t->loadDefaultGuidDatabase(); break;
        case 40: _t->exportDiscoveredGuids(); break;
        case 41: _t->generateReport(); break;
        case 42: _t->currentTabChanged((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        default: ;
        }
    } else if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        switch (_id) {
        default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
        case 1:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QItemSelection >(); break;
            }
            break;
        }
    }
}